

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getOverflowPage(BtShared *pBt,Pgno ovfl,MemPage **ppPage,Pgno *pPgnoNext)

{
  long lVar1;
  Pgno pgno_00;
  Pgno PVar2;
  BtShared *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  BtShared *in_RDI;
  long in_FS_OFFSET;
  Pgno iGuess;
  int rc;
  Pgno next;
  u8 eType;
  Pgno pgno;
  MemPage *pPage;
  int local_54;
  uint in_stack_ffffffffffffffb4;
  undefined3 uVar3;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  u32 pgno_01;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pgno_01 = 0;
  local_54 = 0;
  if (in_RDI->autoVacuum != '\0') {
    pgno_00 = in_ESI + 1;
    while( true ) {
      PVar2 = ptrmapPageno(in_RDI,pgno_00);
      uVar3 = (undefined3)in_stack_ffffffffffffffb8;
      in_stack_ffffffffffffffb8 = CONCAT13(1,uVar3);
      if (PVar2 != pgno_00) {
        in_stack_ffffffffffffffb8 =
             CONCAT13(pgno_00 == (uint)sqlite3PendingByte / in_RDI->pageSize + 1,uVar3);
        in_stack_ffffffffffffffb4 = pgno_00;
      }
      if ((char)((uint)in_stack_ffffffffffffffb8 >> 0x18) == '\0') break;
      pgno_00 = pgno_00 + 1;
    }
    in_stack_ffffffffffffffbc = pgno_00;
    PVar2 = btreePagecount(in_RDI);
    if (pgno_00 <= PVar2) {
      local_54 = ptrmapGet((BtShared *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                           (Pgno)((ulong)in_RDX >> 0x20),(u8 *)in_RCX,
                           (Pgno *)CONCAT44(pgno_01,local_54));
    }
  }
  if ((local_54 == 0) &&
     (local_54 = btreeGetPage(in_RCX,pgno_01,
                              (MemPage **)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb4), local_54 == 0)) {
    pgno_01 = sqlite3Get4byte(puRam0000000000000050);
  }
  *(u32 *)&in_RCX->pPager = pgno_01;
  if (in_RDX == (undefined8 *)0x0) {
    releasePage((MemPage *)0x16d431);
  }
  else {
    *in_RDX = 0;
  }
  if (local_54 == 0x65) {
    local_54 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

static int getOverflowPage(
  BtShared *pBt,               /* The database file */
  Pgno ovfl,                   /* Current overflow page number */
  MemPage **ppPage,            /* OUT: MemPage handle (may be NULL) */
  Pgno *pPgnoNext              /* OUT: Next overflow page number */
){
  Pgno next = 0;
  MemPage *pPage = 0;
  int rc = SQLITE_OK;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert(pPgnoNext);

#ifndef SQLITE_OMIT_AUTOVACUUM
  /* Try to find the next page in the overflow list using the
  ** autovacuum pointer-map pages. Guess that the next page in
  ** the overflow list is page number (ovfl+1). If that guess turns
  ** out to be wrong, fall back to loading the data of page
  ** number ovfl to determine the next page number.
  */
  if( pBt->autoVacuum ){
    Pgno pgno;
    Pgno iGuess = ovfl+1;
    u8 eType;

    while( PTRMAP_ISPAGE(pBt, iGuess) || iGuess==PENDING_BYTE_PAGE(pBt) ){
      iGuess++;
    }

    if( iGuess<=btreePagecount(pBt) ){
      rc = ptrmapGet(pBt, iGuess, &eType, &pgno);
      if( rc==SQLITE_OK && eType==PTRMAP_OVERFLOW2 && pgno==ovfl ){
        next = iGuess;
        rc = SQLITE_DONE;
      }
    }
  }
#endif

  assert( next==0 || rc==SQLITE_DONE );
  if( rc==SQLITE_OK ){
    rc = btreeGetPage(pBt, ovfl, &pPage, (ppPage==0) ? PAGER_GET_READONLY : 0);
    assert( rc==SQLITE_OK || pPage==0 );
    if( rc==SQLITE_OK ){
      next = get4byte(pPage->aData);
    }
  }

  *pPgnoNext = next;
  if( ppPage ){
    *ppPage = pPage;
  }else{
    releasePage(pPage);
  }
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}